

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void libcellml::makeEquivalence(IndexStack *stack1,IndexStack *stack2,ModelPtr *model)

{
  VariablePtr v2;
  VariablePtr v1;
  VariablePtr local_30;
  VariablePtr local_20;
  
  getVariableLocatedAt((libcellml *)&local_20,stack1,model);
  getVariableLocatedAt((libcellml *)&local_30,stack2,model);
  Variable::addEquivalence(&local_20,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void makeEquivalence(const IndexStack &stack1, const IndexStack &stack2, const ModelPtr &model)
{
    auto v1 = getVariableLocatedAt(stack1, model);
    auto v2 = getVariableLocatedAt(stack2, model);
    Variable::addEquivalence(v1, v2);
}